

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer_connection.cpp
# Opt level: O1

bool __thiscall libtorrent::aux::peer_connection::ignore_unchoke_slots(peer_connection *this)

{
  int iVar1;
  session_interface *psVar2;
  element_type *peVar3;
  int iVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar5;
  
  if ((this->super_peer_connection_hot_members).field_0x2c == '\0') {
    return true;
  }
  psVar2 = (this->super_peer_connection_hot_members).m_ses;
  iVar4 = (*(psVar2->super_session_logger)._vptr_session_logger[0x33])
                    (psVar2,&(this->super_peer_connection_hot_members).field_0x2c);
  if ((char)iVar4 != '\0') {
    return true;
  }
  this_00 = (this->super_peer_connection_hot_members).m_torrent.
            super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
  ;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar4 = this_00->_M_use_count;
    do {
      if (iVar4 == 0) {
        this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        break;
      }
      LOCK();
      iVar1 = this_00->_M_use_count;
      bVar5 = iVar4 == iVar1;
      if (bVar5) {
        this_00->_M_use_count = iVar4 + 1;
        iVar1 = iVar4;
      }
      iVar4 = iVar1;
      UNLOCK();
    } while (!bVar5);
  }
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    bVar5 = true;
  }
  else {
    bVar5 = this_00->_M_use_count == 0;
  }
  peVar3 = (this->super_peer_connection_hot_members).m_torrent.
           super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar3 != (element_type *)0x0 && !bVar5) {
    psVar2 = (this->super_peer_connection_hot_members).m_ses;
    iVar4 = (*(psVar2->super_session_logger)._vptr_session_logger[0x33])
                      (psVar2,&peVar3->super_peer_class_set);
    bVar5 = true;
    if ((char)iVar4 != '\0') goto LAB_00243c00;
  }
  bVar5 = false;
LAB_00243c00:
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return bVar5;
}

Assistant:

bool peer_connection::ignore_unchoke_slots() const
	{
		TORRENT_ASSERT(is_single_thread());
		if (num_classes() == 0) return true;

		if (m_ses.ignore_unchoke_slots_set(*this)) return true;
		auto t = m_torrent.lock();
		if (t && m_ses.ignore_unchoke_slots_set(*t)) return true;
		return false;
	}